

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::
SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::insert
          (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *this,
          TypedID<(diligent_spirv_cross::Types)0> *itr,
          TypedID<(diligent_spirv_cross::Types)0> *insert_begin,
          TypedID<(diligent_spirv_cross::Types)0> *insert_end)

{
  TypedID<(diligent_spirv_cross::Types)0> *pTVar1;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar2;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar3;
  TypedID<(diligent_spirv_cross::Types)0> *local_88;
  TypedID<(diligent_spirv_cross::Types)0> *local_70;
  TypedID<(diligent_spirv_cross::Types)0> *source_itr_1;
  TypedID<(diligent_spirv_cross::Types)0> *target_itr_1;
  TypedID<(diligent_spirv_cross::Types)0> *source_itr;
  TypedID<(diligent_spirv_cross::Types)0> *original_source_itr;
  TypedID<(diligent_spirv_cross::Types)0> *target_itr;
  TypedID<(diligent_spirv_cross::Types)0> *new_buffer;
  size_t target_capacity;
  size_t i;
  size_t count;
  TypedID<(diligent_spirv_cross::Types)0> *insert_end_local;
  TypedID<(diligent_spirv_cross::Types)0> *insert_begin_local;
  TypedID<(diligent_spirv_cross::Types)0> *itr_local;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *this_local;
  
  pTVar1 = (TypedID<(diligent_spirv_cross::Types)0> *)((long)insert_end - (long)insert_begin >> 2);
  pTVar2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::end
                     (&this->
                       super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                     );
  if (itr == pTVar2) {
    reserve(this,(long)&pTVar1->id +
                 (this->
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
                 buffer_size);
    insert_end_local = insert_begin;
    for (target_capacity = 0; target_capacity < pTVar1; target_capacity = target_capacity + 1) {
      (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).ptr
      [(this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
       buffer_size + target_capacity].id = insert_end_local->id;
      insert_end_local = insert_end_local + 1;
    }
    (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
    buffer_size = (long)&pTVar1->id +
                  (this->
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
                  buffer_size;
  }
  else {
    if (this->buffer_capacity <
        (long)&pTVar1->id +
        (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
        buffer_size) {
      new_buffer = (TypedID<(diligent_spirv_cross::Types)0> *)
                   ((long)&pTVar1->id +
                   (this->
                   super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>)
                   .buffer_size);
      if (new_buffer == (TypedID<(diligent_spirv_cross::Types)0> *)0x0) {
        new_buffer = (TypedID<(diligent_spirv_cross::Types)0> *)0x1;
      }
      if (new_buffer < (TypedID<(diligent_spirv_cross::Types)0> *)0x8) {
        new_buffer = (TypedID<(diligent_spirv_cross::Types)0> *)0x8;
      }
      for (; new_buffer < pTVar1;
          new_buffer = (TypedID<(diligent_spirv_cross::Types)0> *)((long)new_buffer << 1)) {
      }
      if (new_buffer < (TypedID<(diligent_spirv_cross::Types)0> *)0x9) {
        local_88 = AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   ::data(&this->stack_storage);
      }
      else {
        local_88 = (TypedID<(diligent_spirv_cross::Types)0> *)malloc((long)new_buffer << 2);
      }
      if (local_88 == (TypedID<(diligent_spirv_cross::Types)0> *)0x0) {
        ::std::terminate();
      }
      original_source_itr = local_88;
      source_itr = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::begin
                             (&this->
                               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                             );
      target_itr_1 = insert_begin;
      if (local_88 !=
          (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
          ptr) {
        for (; source_itr != itr; source_itr = source_itr + 1) {
          original_source_itr->id = source_itr->id;
          original_source_itr = original_source_itr + 1;
        }
      }
      for (; target_itr_1 != insert_end; target_itr_1 = target_itr_1 + 1) {
        original_source_itr->id = target_itr_1->id;
        original_source_itr = original_source_itr + 1;
      }
      if ((local_88 !=
           (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
           ptr) || (insert_begin != insert_end)) {
        for (; pTVar2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::
                        end(&this->
                             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                           ), source_itr != pTVar2; source_itr = source_itr + 1) {
          original_source_itr->id = source_itr->id;
          original_source_itr = original_source_itr + 1;
        }
      }
      pTVar2 = (this->
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).ptr
      ;
      pTVar3 = AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::
               data(&this->stack_storage);
      if (pTVar2 != pTVar3) {
        free((this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
             ).ptr);
      }
      (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).ptr =
           local_88;
      this->buffer_capacity = (size_t)new_buffer;
    }
    else {
      pTVar2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::end
                         (&this->
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                         );
      source_itr_1 = pTVar2 + (long)pTVar1;
      local_70 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::end
                           (&this->
                             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                           );
      while (pTVar2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::
                      end(&this->
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                         ), source_itr_1 != pTVar2 && local_70 != itr) {
        source_itr_1 = source_itr_1 + -1;
        local_70 = local_70 + -1;
        source_itr_1->id = local_70->id;
      }
      ::std::
      move_backward<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*>
                (itr,local_70,source_itr_1);
      insert_end_local = insert_begin;
      insert_begin_local = itr;
      while (pTVar2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::
                      end(&this->
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                         ), insert_begin_local != pTVar2 && insert_end_local != insert_end) {
        insert_begin_local->id = insert_end_local->id;
        insert_end_local = insert_end_local + 1;
        insert_begin_local = insert_begin_local + 1;
      }
      for (; insert_end_local != insert_end; insert_end_local = insert_end_local + 1) {
        insert_begin_local->id = insert_end_local->id;
        insert_begin_local = insert_begin_local + 1;
      }
    }
    (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
    buffer_size = (long)&pTVar1->id +
                  (this->
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
                  buffer_size;
  }
  return;
}

Assistant:

void insert(T *itr, const T *insert_begin, const T *insert_end) SPIRV_CROSS_NOEXCEPT
	{
		auto count = size_t(insert_end - insert_begin);
		if (itr == this->end())
		{
			reserve(this->buffer_size + count);
			for (size_t i = 0; i < count; i++, insert_begin++)
				new (&this->ptr[this->buffer_size + i]) T(*insert_begin);
			this->buffer_size += count;
		}
		else
		{
			if (this->buffer_size + count > buffer_capacity)
			{
				auto target_capacity = this->buffer_size + count;
				if (target_capacity == 0)
					target_capacity = 1;
				if (target_capacity < N)
					target_capacity = N;

				while (target_capacity < count)
					target_capacity <<= 1u;

				// Need to allocate new buffer. Move everything to a new buffer.
				T *new_buffer =
				    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

				// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
				if (!new_buffer)
					std::terminate();

				// First, move elements from source buffer to new buffer.
				// We don't deal with types which can throw in move constructor.
				auto *target_itr = new_buffer;
				auto *original_source_itr = this->begin();

				if (new_buffer != this->ptr)
				{
					while (original_source_itr != itr)
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				// Copy-construct new elements.
				for (auto *source_itr = insert_begin; source_itr != insert_end; ++source_itr, ++target_itr)
					new (target_itr) T(*source_itr);

				// Move over the other half.
				if (new_buffer != this->ptr || insert_begin != insert_end)
				{
					while (original_source_itr != this->end())
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				if (this->ptr != stack_storage.data())
					free(this->ptr);
				this->ptr = new_buffer;
				buffer_capacity = target_capacity;
			}
			else
			{
				// Move in place, need to be a bit careful about which elements are constructed and which are not.
				// Move the end and construct the new elements.
				auto *target_itr = this->end() + count;
				auto *source_itr = this->end();
				while (target_itr != this->end() && source_itr != itr)
				{
					--target_itr;
					--source_itr;
					new (target_itr) T(std::move(*source_itr));
				}

				// For already constructed elements we can move-assign.
				std::move_backward(itr, source_itr, target_itr);

				// For the inserts which go to already constructed elements, we can do a plain copy.
				while (itr != this->end() && insert_begin != insert_end)
					*itr++ = *insert_begin++;

				// For inserts into newly allocated memory, we must copy-construct instead.
				while (insert_begin != insert_end)
				{
					new (itr) T(*insert_begin);
					++itr;
					++insert_begin;
				}
			}

			this->buffer_size += count;
		}
	}